

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctaes.c
# Opt level: O2

void AES_setup(AES_state *rounds,uint8_t *key,int nkeywords,int nrounds)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int b_2;
  long lVar6;
  AES_state *pAVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ushort uVar12;
  ushort uVar13;
  ushort uVar14;
  ushort uVar15;
  ushort uVar16;
  ushort uVar17;
  uint uVar18;
  uint16_t top;
  ushort uVar19;
  long in_FS_OFFSET;
  AES_state column;
  AES_state rcon;
  AES_state local_58;
  ushort local_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  _local_48 = 1;
  uStack_40 = 0;
  pAVar7 = rounds;
  for (lVar6 = 0; lVar6 <= nrounds; lVar6 = lVar6 + 1) {
    for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
      pAVar7->slice[lVar11] = 0;
    }
    pAVar7 = pAVar7 + 1;
  }
  uVar8 = 0;
  uVar18 = 0;
  if (0 < nkeywords) {
    uVar8 = 0;
    uVar18 = nkeywords;
  }
  for (; uVar8 != uVar18; uVar8 = uVar8 + 1) {
    for (lVar6 = 0; (int)lVar6 != 4; lVar6 = lVar6 + 1) {
      LoadByte(rounds + (uVar8 >> 2),key[lVar6],(int)lVar6,uVar8 & 3);
    }
    key = key + lVar6;
  }
  for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
    local_58.slice[lVar6] =
         rounds[nkeywords - 1U >> 2].slice[lVar6] >> ((byte)(nkeywords - 1U) & 3) & 0x1111;
  }
  uVar2 = 1;
  uVar1 = 0;
  uVar4 = 0;
  uVar15 = 0;
  iVar9 = 0;
  uVar16 = 0;
  uVar13 = 0;
  uVar17 = 0;
  uVar19 = 0;
  for (iVar10 = nkeywords; iVar10 < nrounds * 4 + 4; iVar10 = iVar10 + 1) {
    if (iVar9 == 0) {
      SubBytes(&local_58,0);
      for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
        local_58.slice[lVar6] =
             (local_58.slice[lVar6] << 0xc | local_58.slice[lVar6] >> 4) ^ (&local_48)[lVar6];
      }
      uVar3 = uVar4 ^ uVar13;
      uStack_40 = CONCAT62(CONCAT42(CONCAT22(uVar16,uVar15),uVar19),uVar3);
      uVar4 = uVar1 ^ uVar13;
      uVar5 = uVar2 ^ uVar13;
      _local_48 = CONCAT62(CONCAT42(CONCAT22(uVar4,uVar17),uVar5),uVar13);
      uVar12 = uVar15;
      uVar14 = uVar16;
      uVar2 = uVar13;
      uVar1 = uVar17;
      uVar15 = uVar19;
    }
    else {
      uVar12 = uVar16;
      uVar14 = uVar13;
      uVar5 = uVar17;
      uVar3 = uVar19;
      if (iVar9 == 4 && 6 < nkeywords) {
        SubBytes(&local_58,0);
      }
    }
    iVar9 = iVar9 + 1;
    for (lVar6 = 0; lVar6 != 8; lVar6 = lVar6 + 1) {
      uVar16 = rounds[iVar10 - nkeywords >> 2].slice[lVar6] >> ((byte)(iVar10 - nkeywords) & 3) &
               0x1111 ^ local_58.slice[lVar6];
      local_58.slice[lVar6] = uVar16;
      rounds[iVar10 >> 2].slice[lVar6] =
           rounds[iVar10 >> 2].slice[lVar6] | (ushort)((uVar16 & 0x1111) << ((byte)iVar10 & 3));
    }
    if (iVar9 == nkeywords) {
      iVar9 = 0;
    }
    uVar16 = uVar12;
    uVar13 = uVar14;
    uVar17 = uVar5;
    uVar19 = uVar3;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void AES_setup(AES_state* rounds, const uint8_t* key, int nkeywords, int nrounds)
{
    int i;

    /* The one-byte round constant */
    AES_state rcon = {{1,0,0,0,0,0,0,0}};
    /* The number of the word being generated, modulo nkeywords */
    int pos = 0;
    /* The column representing the word currently being processed */
    AES_state column;

    for (i = 0; i < nrounds + 1; i++) {
        int b;
        for (b = 0; b < 8; b++) {
            rounds[i].slice[b] = 0;
        }
    }

    /* The first nkeywords round columns are just taken from the key directly. */
    for (i = 0; i < nkeywords; i++) {
        int r;
        for (r = 0; r < 4; r++) {
            LoadByte(&rounds[i >> 2], *(key++), r, i & 3);
        }
    }

    GetOneColumn(&column, &rounds[(nkeywords - 1) >> 2], (nkeywords - 1) & 3);

    for (i = nkeywords; i < 4 * (nrounds + 1); i++) {
        /* Transform column */
        if (pos == 0) {
            SubBytes(&column, 0);
            KeySetupTransform(&column, &rcon);
            MultX(&rcon);
        } else if (nkeywords > 6 && pos == 4) {
            SubBytes(&column, 0);
        }
        if (++pos == nkeywords) pos = 0;
        KeySetupColumnMix(&column, &rounds[i >> 2], &rounds[(i - nkeywords) >> 2], i & 3, (i - nkeywords) & 3);
    }
}